

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryOpenSubdir(InMemoryDirectory *this,PathPtr path)

{
  undefined8 uVar1;
  long in_RCX;
  undefined8 *puVar2;
  ReadableDirectory *extraout_RDX;
  ReadableDirectory *extraout_RDX_00;
  ReadableDirectory *pRVar3;
  char *pcVar4;
  ReadableDirectory *extraout_RDX_01;
  ReadableDirectory *extraout_RDX_02;
  ReadableDirectory *extraout_RDX_03;
  InMemoryFileFactory *pIVar5;
  _func_int **pp_Var6;
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> MVar7;
  StringPtr name;
  StringPtr name_00;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_50 [24];
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *local_38;
  
  puVar2 = (undefined8 *)path.parts.size_;
  name_00.content.ptr =
       (Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)path.parts.ptr;
  if (in_RCX == 1) {
    local_50[0] = 0;
    kj::_::Mutex::lock((Mutex *)&name_00.content.ptr[1].ptr,1);
    local_38 = name_00.content.ptr + 3;
    if (puVar2[1] == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*puVar2;
    }
    name.content.size_ = (size_t)pcVar4;
    name.content.ptr = (char *)local_38;
    local_50._16_8_ = &name_00.content.ptr[1].ptr;
    Impl::tryGetEntry((Impl *)local_50,name);
    if (CONCAT71(local_50._1_7_,local_50[0]) == 0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      pRVar3 = extraout_RDX_00;
    }
    else {
      MVar7 = asDirectory(this,name_00.content.ptr,(EntryImpl *)(local_50 + 0x10));
      pRVar3 = MVar7.ptr.ptr;
    }
    if ((Mutex *)local_50._16_8_ != (Mutex *)0x0) {
      kj::_::Mutex::unlock((Mutex *)local_50._16_8_,SHARED,(Waiter *)0x0);
      pRVar3 = extraout_RDX_02;
    }
  }
  else if (in_RCX == 0) {
    (*(code *)(name_00.content.ptr)->mutex[1].waitersTail)(local_50,name_00.content.ptr);
    pIVar5 = (InMemoryFileFactory *)local_50._8_8_;
    if ((InMemoryFileFactory *)local_50._8_8_ == (InMemoryFileFactory *)0x0) {
      pIVar5 = (InMemoryFileFactory *)0x0;
      pp_Var6 = (_func_int **)0x0;
    }
    else {
      pp_Var6 = (_func_int **)CONCAT71(local_50._1_7_,local_50[0]);
      local_50._8_8_ = (InMemoryFileFactory *)0x0;
    }
    uVar1 = local_50._8_8_;
    pRVar3 = extraout_RDX;
    if ((InMemoryFileFactory *)local_50._8_8_ != (InMemoryFileFactory *)0x0) {
      local_50._8_8_ = (InMemoryFileFactory *)0x0;
      (*(code *)**(undefined8 **)CONCAT71(local_50._1_7_,local_50[0]))
                ((undefined8 *)CONCAT71(local_50._1_7_,local_50[0]),
                 (InMemoryFileFactory *)(uVar1 + *(long *)(*(_func_int **)uVar1 + -0x10)));
      pRVar3 = extraout_RDX_01;
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = pp_Var6;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)pIVar5;
  }
  else {
    if (puVar2[1] == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*puVar2;
    }
    name_00.content.size_ = (size_t)pcVar4;
    MVar7 = tryGetParent((InMemoryDirectory *)local_50,name_00);
    pRVar3 = MVar7.ptr.ptr;
    if ((InMemoryFileFactory *)local_50._8_8_ == (InMemoryFileFactory *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (**(code **)(*(_func_int **)local_50._8_8_ + 0x58))
                (this,local_50._8_8_,puVar2 + 3,in_RCX + -1);
      (*(code *)**(undefined8 **)CONCAT71(local_50._1_7_,local_50[0]))
                ((undefined8 *)CONCAT71(local_50._1_7_,local_50[0]),
                 (InMemoryFileFactory *)
                 (local_50._8_8_ + *(long *)(*(_func_int **)local_50._8_8_ + -0x10)));
      pRVar3 = extraout_RDX_03;
    }
  }
  MVar7.ptr.ptr = pRVar3;
  MVar7.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>)MVar7.ptr;
}

Assistant:

Maybe<Own<const ReadableDirectory>> tryOpenSubdir(PathPtr path) const override {
    if (path.size() == 0) {
      return clone();
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        return asDirectory(lock, entry);
      } else {
        return kj::none;
      }
    }